

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.h
# Opt level: O2

void __thiscall
Js::IndexPropertyDescriptor::IndexPropertyDescriptor
          (IndexPropertyDescriptor *this,Var getter,Var setter)

{
  this->Attributes = '\a';
  Memory::WriteBarrierPtr<void>::WriteBarrierSet(&this->Getter,getter);
  Memory::WriteBarrierPtr<void>::WriteBarrierSet(&this->Setter,setter);
  return;
}

Assistant:

IndexPropertyDescriptor(Var getter, Var setter)
            : Attributes(PropertyDynamicTypeDefaults), Getter(getter), Setter(setter)
        {
        }